

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_utf8fromwc(char *dst,uint dstlen,wchar_t *src,uint srclen)

{
  wchar_t wVar1;
  byte bVar2;
  uint uVar3;
  wchar_t local_38;
  uint ucs_1;
  uint ucs;
  uint count;
  uint i;
  uint srclen_local;
  wchar_t *src_local;
  uint dstlen_local;
  char *dst_local;
  
  ucs = 0;
  ucs_1 = 0;
  uVar3 = ucs_1;
  if (dstlen != 0) {
LAB_00262dbc:
    do {
      ucs_1 = uVar3;
      if (srclen <= ucs) {
        dst[ucs_1] = '\0';
        return ucs_1;
      }
      uVar3 = ucs + 1;
      local_38 = src[ucs];
      bVar2 = (byte)local_38;
      ucs = uVar3;
      if (0x7f < (uint)local_38) {
        if ((uint)local_38 < 0x800) {
          if (dstlen <= ucs_1 + 2) {
            dst[ucs_1] = '\0';
            ucs_1 = ucs_1 + 2;
            goto LAB_00263014;
          }
          dst[ucs_1] = (byte)((uint)local_38 >> 6) | 0xc0;
          dst[ucs_1 + 1] = bVar2 & 0x3f | 0x80;
          uVar3 = ucs_1 + 2;
          goto LAB_00262dbc;
        }
        if (0xffff < (uint)local_38) {
          if ((uint)local_38 < 0x110000) {
            if (dstlen <= ucs_1 + 4) {
              dst[ucs_1] = '\0';
              ucs_1 = ucs_1 + 4;
              goto LAB_00263014;
            }
            dst[ucs_1] = (byte)((uint)local_38 >> 0x12) | 0xf0;
            dst[ucs_1 + 1] = (byte)((uint)local_38 >> 0xc) & 0x3f | 0x80;
            dst[ucs_1 + 2] = (byte)((uint)local_38 >> 6) & 0x3f | 0x80;
            dst[ucs_1 + 3] = bVar2 & 0x3f | 0x80;
            uVar3 = ucs_1 + 4;
            goto LAB_00262dbc;
          }
          local_38 = L'�';
        }
        if (dstlen <= ucs_1 + 3) {
          dst[ucs_1] = '\0';
          ucs_1 = ucs_1 + 3;
          goto LAB_00263014;
        }
        dst[ucs_1] = (byte)((uint)local_38 >> 0xc) | 0xe0;
        dst[ucs_1 + 1] = (byte)((uint)local_38 >> 6) & 0x3f | 0x80;
        dst[ucs_1 + 2] = (byte)local_38 & 0x3f | 0x80;
        uVar3 = ucs_1 + 3;
        goto LAB_00262dbc;
      }
      uVar3 = ucs_1 + 1;
      dst[ucs_1] = bVar2;
    } while (uVar3 < dstlen);
    dst[ucs_1] = '\0';
    ucs_1 = uVar3;
  }
LAB_00263014:
  while (ucs < srclen) {
    uVar3 = ucs + 1;
    wVar1 = src[ucs];
    ucs = uVar3;
    if ((uint)wVar1 < 0x80) {
      ucs_1 = ucs_1 + 1;
    }
    else if ((uint)wVar1 < 0x800) {
      ucs_1 = ucs_1 + 2;
    }
    else if (((uint)wVar1 < 0x10000) || (0x10ffff < (uint)wVar1)) {
      ucs_1 = ucs_1 + 3;
    }
    else {
      ucs_1 = ucs_1 + 4;
    }
  }
  return ucs_1;
}

Assistant:

unsigned fl_utf8fromwc(char* dst, unsigned dstlen,
		    const wchar_t* src, unsigned srclen) {
  unsigned i = 0;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned ucs;
    if (i >= srclen) {dst[count] = 0; return count;}
    ucs = src[i++];
    if (ucs < 0x80U) {
      dst[count++] = ucs;
      if (count >= dstlen) {dst[count-1] = 0; break;}
    } else if (ucs < 0x800U) { /* 2 bytes */
      if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
      dst[count++] = 0xc0 | (ucs >> 6);
      dst[count++] = 0x80 | (ucs & 0x3F);
#if defined(WIN32) || defined(__CYGWIN__)
    } else if (ucs >= 0xd800 && ucs <= 0xdbff && i < srclen &&
	       src[i] >= 0xdc00 && src[i] <= 0xdfff) {
      /* surrogate pair */
      unsigned ucs2 = src[i++];
      ucs = 0x10000U + ((ucs&0x3ff)<<10) + (ucs2&0x3ff);
      /* all surrogate pairs turn into 4-byte UTF-8 */
#else
    } else if (ucs >= 0x10000) {
      if (ucs > 0x10ffff) {
	ucs = 0xfffd;
	goto J1;
      }
#endif
      if (count+4 >= dstlen) {dst[count] = 0; count += 4; break;}
      dst[count++] = 0xf0 | (ucs >> 18);
      dst[count++] = 0x80 | ((ucs >> 12) & 0x3F);
      dst[count++] = 0x80 | ((ucs >> 6) & 0x3F);
      dst[count++] = 0x80 | (ucs & 0x3F);
    } else {
#if !(defined(WIN32) || defined(__CYGWIN__))
    J1:
#endif
      /* all others are 3 bytes: */
      if (count+3 >= dstlen) {dst[count] = 0; count += 3; break;}
      dst[count++] = 0xe0 | (ucs >> 12);
      dst[count++] = 0x80 | ((ucs >> 6) & 0x3F);
      dst[count++] = 0x80 | (ucs & 0x3F);
    }
  }
  /* we filled dst, measure the rest: */
  while (i < srclen) {
    unsigned ucs = src[i++];
    if (ucs < 0x80U) {
      count++;
    } else if (ucs < 0x800U) { /* 2 bytes */
      count += 2;
#if defined(WIN32) || defined(__CYGWIN__)
    } else if (ucs >= 0xd800 && ucs <= 0xdbff && i < srclen-1 &&
	       src[i+1] >= 0xdc00 && src[i+1] <= 0xdfff) {
      /* surrogate pair */
      ++i;
#else
    } else if (ucs >= 0x10000 && ucs <= 0x10ffff) {
#endif
      count += 4;
    } else {
      count += 3;
    }
  }
  return count;
}